

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1109b::FragmentURITest_ParseRangeEnd_Test::~FragmentURITest_ParseRangeEnd_Test
          (FragmentURITest_ParseRangeEnd_Test *this)

{
  void *in_RDI;
  
  ~FragmentURITest_ParseRangeEnd_Test((FragmentURITest_ParseRangeEnd_Test *)0x128268);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST_F(FragmentURITest, ParseRangeEnd) {
    EXPECT_EQ(ktx::parseFragmentURI("m=,0").mip, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("a=,0").stratal, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("f=,0").facial, ktx::SelectorRange(0, 1));

    EXPECT_EQ(ktx::parseFragmentURI("m=,1").mip, ktx::SelectorRange(0, 2));
    EXPECT_EQ(ktx::parseFragmentURI("a=,1").stratal, ktx::SelectorRange(0, 2));
    EXPECT_EQ(ktx::parseFragmentURI("f=,1").facial, ktx::SelectorRange(0, 2));
}